

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

Bool IsImage(ctmbstr iType)

{
  Bool BVar1;
  int iVar2;
  uint maxExt;
  long lVar3;
  tmbchar ext [20];
  
  BVar1 = IsFilePath(iType);
  if (BVar1 == no) {
    BVar1 = no;
  }
  else {
    GetFileExtension(iType,ext,maxExt);
    lVar3 = 0;
    do {
      if (lVar3 == 0x34) {
        return no;
      }
      iVar2 = prvTidytmbstrcasecmp
                        (ext,(ctmbstr)((long)&imageExtensions_rel +
                                      (long)*(int *)((long)&imageExtensions_rel + lVar3)));
      lVar3 = lVar3 + 4;
    } while (iVar2 != 0);
    BVar1 = yes;
  }
  return BVar1;
}

Assistant:

static Bool IsImage( ctmbstr iType )
{
    uint i;
    tmbchar ext[20];

    if ( !IsFilePath(iType) ) return 0;

    GetFileExtension( iType, ext, sizeof(ext) );

    /* Compare it to the array of known image file extensions */
    for (i = 0; i < N_IMAGE_EXTS; i++)
    {
        if ( TY_(tmbstrcasecmp)(ext, imageExtensions[i]) == 0 )
            return yes;
    }
    
    return no;
}